

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

lzma_ret lzma_memlimit_set(lzma_stream *strm,uint64_t new_memlimit)

{
  lzma_internal *plVar1;
  _func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *p_Var2;
  lzma_ret lVar3;
  uint64_t memusage;
  uint64_t old_memlimit;
  
  old_memlimit = 0xb;
  lVar3 = LZMA_PROG_ERROR;
  if (((strm != (lzma_stream *)0x0) && (plVar1 = strm->internal, plVar1 != (lzma_internal *)0x0)) &&
     (p_Var2 = (plVar1->next).memconfig,
     p_Var2 != (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *)0x0))
  {
    if (new_memlimit - 1 < 0x7fff) {
      return LZMA_MEMLIMIT_ERROR;
    }
    lVar3 = (*p_Var2)((plVar1->next).coder,&memusage,&old_memlimit,new_memlimit);
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_memlimit_set(lzma_stream *strm, uint64_t new_memlimit)
{
	// Dummy variables to simplify memconfig functions
	uint64_t old_memlimit;
	uint64_t memusage;

	if (strm == NULL || strm->internal == NULL
			|| strm->internal->next.memconfig == NULL)
		return LZMA_PROG_ERROR;

	if (new_memlimit != 0 && new_memlimit < LZMA_MEMUSAGE_BASE)
		return LZMA_MEMLIMIT_ERROR;

	return strm->internal->next.memconfig(strm->internal->next.coder,
			&memusage, &old_memlimit, new_memlimit);
}